

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

int soft_f64_compare(float64 a,float64 b,_Bool is_quiet,float_status *s)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  FloatParts FVar12;
  FloatParts FVar13;
  
  FVar12._8_8_ = a >> 0x34 & 0x7ff | a >> 0x17 & 0x10000000000;
  FVar12.frac = a & 0xfffffffffffff;
  FVar12 = sf_canonicalize(FVar12,&float64_params,s);
  uVar7 = FVar12._8_8_;
  uVar4 = FVar12.frac;
  FVar13._8_8_ = b >> 0x34 & 0x7ff | b >> 0x17 & 0x10000000000;
  FVar13.frac = b & 0xfffffffffffff;
  FVar13 = sf_canonicalize(FVar13,&float64_params,s);
  uVar8 = FVar13._8_8_;
  uVar5 = FVar13.frac;
  if (((uVar7 | uVar8) & 0xfc00000000) != 0) {
    if ((((uVar7 & 0xff00000000) != 0x500000000) && (is_quiet)) &&
       ((uVar8 & 0xff00000000) != 0x500000000)) {
      return 2;
    }
    s->float_exception_flags = s->float_exception_flags | 1;
    return 2;
  }
  uVar10 = FVar12._12_4_;
  uVar2 = FVar13._12_4_;
  if ((uVar10 & 3) == 1) {
    if ((uVar8 & 0x300000000) == 0x100000000) {
      return 0;
    }
LAB_00d08bbd:
    return (uVar2 >> 8 & 1) - 1 | 1;
  }
  uVar3 = uVar10 >> 8;
  uVar11 = uVar2 & 3;
  if (uVar11 != 1) {
    if ((uVar10 & 3) == 3) {
      if ((uVar11 == 3) && (((uVar2 ^ uVar10) >> 8 & 1) == 0)) {
        return 0;
      }
    }
    else {
      if (uVar11 == 3) goto LAB_00d08bbd;
      if (((uVar2 ^ uVar10) >> 8 & 1) == 0) {
        iVar9 = FVar12.exp;
        iVar6 = FVar13.exp;
        if (iVar9 != iVar6) {
          if ((uVar7 >> 0x28 & 1) == 0) {
            bVar1 = iVar6 < iVar9;
          }
          else {
            bVar1 = iVar9 <= iVar6;
          }
          return (uint)bVar1 * 2 + -1;
        }
        if (uVar4 == uVar5) {
          return 0;
        }
        if ((uVar7 >> 0x28 & 1) == 0) {
          uVar2 = (uVar5 < uVar4) - 1;
        }
        else {
          uVar2 = -(uint)(uVar5 < uVar4);
        }
        goto LAB_00d08b9d;
      }
      uVar3 = uVar10 >> 8 & 0xff;
    }
  }
  uVar2 = -(uVar3 & 1);
LAB_00d08b9d:
  return uVar2 | 1;
}

Assistant:

static int QEMU_FLATTEN
f64_compare(float64 xa, float64 xb, bool is_quiet, float_status *s)
{
    union_float64 ua, ub;

    ua.s = xa;
    ub.s = xb;

    if (QEMU_NO_HARDFLOAT) {
        goto soft;
    }

    float64_input_flush2(&ua.s, &ub.s, s);
    if (isgreaterequal(ua.h, ub.h)) {
        if (isgreater(ua.h, ub.h)) {
            return float_relation_greater;
        }
        return float_relation_equal;
    }
    if (likely(isless(ua.h, ub.h))) {
        return float_relation_less;
    }
    /* The only condition remaining is unordered.
     * Fall through to set flags.
     */
 soft:
    return soft_f64_compare(ua.s, ub.s, is_quiet, s);
}